

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cpp
# Opt level: O1

void __thiscall QUEUE::print(QUEUE *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  iVar1 = STACK::operator_cast_to_int(&this->s2);
  iVar2 = STACK::operator_cast_to_int(&this->super_STACK);
  if (0 < iVar1) {
    iVar4 = iVar1 + -1;
    do {
      iVar3 = STACK::operator[](&this->s2,iVar4);
      std::ostream::operator<<((ostream *)&std::cout,iVar3);
      bVar5 = iVar4 != 0;
      iVar4 = iVar4 + -1;
      if (bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      }
    } while (iVar4 != -1);
  }
  if (iVar2 != 0 && iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  }
  if (0 < iVar2) {
    iVar1 = 0;
    do {
      iVar4 = STACK::operator[](&this->super_STACK,iVar1);
      std::ostream::operator<<((ostream *)&std::cout,iVar4);
      if (iVar1 - iVar2 != -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 != iVar2);
  }
  return;
}

Assistant:

void QUEUE::print() const {
  int output_len = int(s2);
  int input_len = this->STACK::operator int();
  if (output_len != 0) {
    for (int i = 0; i < output_len; i++) {
      std::cout << s2[output_len - 1 - i];
      if (i != output_len - 1)
        std::cout << " ";
    }
  }
  if (output_len != 0 && input_len != 0)
    std::cout << " ";
  if (input_len != 0) {
    for (int i = 0; i < input_len; i++) {
      std::cout << this->STACK::operator[](i);
      if (i != input_len - 1)
        std::cout << " ";
    }
  }
}